

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

void __thiscall gl4cts::MultiBind::Texture::Init(Texture *this,Context *context)

{
  Release(this);
  this->m_context = context;
  return;
}

Assistant:

void Texture::Init(deqp::Context& context)
{
	Release();

	m_context = &context;
}